

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

spv_result_t
anon_unknown.dwarf_21a23dd::GetNumericIds
          (AssemblyGrammar *grammar,MessageConsumer *consumer,spv_text text,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *numeric_ids)

{
  bool bVar1;
  spv_result_t sVar2;
  DiagnosticStream *this;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_3f0;
  undefined1 local_3c0 [8];
  spv_instruction_t inst;
  DiagnosticStream local_390;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_1b8;
  undefined1 local_188 [8];
  AssemblyContext context;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *numeric_ids_local;
  spv_text text_local;
  MessageConsumer *consumer_local;
  AssemblyGrammar *grammar_local;
  
  context.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)numeric_ids;
  memset(&local_1b8,0,0x30);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set(&local_1b8);
  spvtools::AssemblyContext::AssemblyContext((AssemblyContext *)local_188,text,consumer,&local_1b8);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_1b8);
  if (text->str == (char *)0x0) {
    spvtools::AssemblyContext::diagnostic(&local_390,(AssemblyContext *)local_188);
    this = spvtools::DiagnosticStream::operator<<
                     (&local_390,(char (*) [23])"Missing assembly text.");
    grammar_local._4_4_ = spvtools::DiagnosticStream::operator_cast_to_spv_result_t(this);
    spvtools::DiagnosticStream::~DiagnosticStream(&local_390);
    inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    bVar1 = spvtools::AssemblyGrammar::isValid(grammar);
    if (bVar1) {
      spvtools::AssemblyContext::advance((AssemblyContext *)local_188);
      do {
        bVar1 = spvtools::AssemblyContext::hasText((AssemblyContext *)local_188);
        if (!bVar1) goto LAB_00aefc13;
        spv_instruction_t::spv_instruction_t((spv_instruction_t *)local_3c0);
        local_3c0._0_4_ = Max;
        sVar2 = spvTextEncodeOpcode(grammar,(AssemblyContext *)local_188,
                                    (spv_instruction_t *)local_3c0);
        if (sVar2 == SPV_SUCCESS) {
          sVar2 = spvtools::AssemblyContext::advance((AssemblyContext *)local_188);
          if (sVar2 == SPV_SUCCESS) {
            inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          }
          else {
            inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
          }
        }
        else {
          grammar_local._4_4_ = SPV_ERROR_INVALID_TEXT;
          inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
        spv_instruction_t::~spv_instruction_t((spv_instruction_t *)local_3c0);
      } while (inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ == 0);
      if (inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 3) {
LAB_00aefc13:
        spvtools::AssemblyContext::GetNumericIds(&local_3f0,(AssemblyContext *)local_188);
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   context.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   &local_3f0);
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                  (&local_3f0);
        grammar_local._4_4_ = SPV_SUCCESS;
        inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
    }
    else {
      grammar_local._4_4_ = SPV_ERROR_INVALID_TABLE;
      inst.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
  }
  spvtools::AssemblyContext::~AssemblyContext((AssemblyContext *)local_188);
  return grammar_local._4_4_;
}

Assistant:

spv_result_t GetNumericIds(const spvtools::AssemblyGrammar& grammar,
                           const spvtools::MessageConsumer& consumer,
                           const spv_text text,
                           std::set<uint32_t>* numeric_ids) {
  spvtools::AssemblyContext context(text, consumer);

  if (!text->str) return context.diagnostic() << "Missing assembly text.";

  if (!grammar.isValid()) {
    return SPV_ERROR_INVALID_TABLE;
  }

  // Skip past whitespace and comments.
  context.advance();

  while (context.hasText()) {
    spv_instruction_t inst;

    // Operand parsing sometimes involves knowing the opcode of the instruction
    // being parsed. A malformed input might feature such an operand *before*
    // the opcode is known. To guard against accessing an uninitialized opcode,
    // the instruction's opcode is initialized to a default value.
    inst.opcode = spv::Op::Max;

    if (spvTextEncodeOpcode(grammar, &context, &inst)) {
      return SPV_ERROR_INVALID_TEXT;
    }

    if (context.advance()) break;
  }

  *numeric_ids = context.GetNumericIds();
  return SPV_SUCCESS;
}